

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

CompensatedFloat pbrt::TwoSum<float>(float a,float b)

{
  float v;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float db;
  float da;
  float bp;
  float ap;
  float s;
  CompensatedFloat local_8;
  
  v = in_XMM0_Da + in_XMM1_Da;
  CompensatedFloat::CompensatedFloat
            (&local_8,v,(in_XMM0_Da - (v - in_XMM1_Da)) + (in_XMM1_Da - (v - (v - in_XMM1_Da))));
  return local_8;
}

Assistant:

PBRT_CPU_GPU inline CompensatedFloat TwoSum(Float a, Float b) {
    Float s = a + b;
    Float ap = s - b;
    Float bp = s - ap;
    Float da = a - ap;
    Float db = b - bp;
    return {s, da + db};
}